

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O3

void RangeEnc_ShiftLow(CRangeEnc *p)

{
  UInt64 *pUVar1;
  Byte BVar2;
  ulong uVar3;
  UInt64 UVar4;
  Byte *pBVar5;
  
  uVar3 = p->low;
  if (uVar3 >> 0x18 == 0xff) {
    UVar4 = p->cacheSize + 1;
  }
  else {
    BVar2 = p->cache;
    do {
      pBVar5 = p->buf;
      *pBVar5 = BVar2 + *(char *)((long)&p->low + 4);
      pBVar5 = pBVar5 + 1;
      p->buf = pBVar5;
      if (pBVar5 == p->bufLim) {
        RangeEnc_FlushStream(p);
      }
      pUVar1 = &p->cacheSize;
      *pUVar1 = *pUVar1 - 1;
      BVar2 = 0xff;
    } while (*pUVar1 != 0);
    uVar3 = p->low;
    p->cache = (Byte)(uVar3 >> 0x18);
    UVar4 = 1;
  }
  p->cacheSize = UVar4;
  p->low = (ulong)(uint)((int)uVar3 << 8);
  return;
}

Assistant:

static void MY_FAST_CALL RangeEnc_ShiftLow(CRangeEnc *p)
{
  if ((UInt32)p->low < (UInt32)0xFF000000 || (unsigned)(p->low >> 32) != 0)
  {
    Byte temp = p->cache;
    do
    {
      Byte *buf = p->buf;
      *buf++ = (Byte)(temp + (Byte)(p->low >> 32));
      p->buf = buf;
      if (buf == p->bufLim)
        RangeEnc_FlushStream(p);
      temp = 0xFF;
    }
    while (--p->cacheSize != 0);
    p->cache = (Byte)((UInt32)p->low >> 24);
  }
  p->cacheSize++;
  p->low = (UInt32)p->low << 8;
}